

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlantUmlGenerator.cpp
# Opt level: O0

void __thiscall
PlantUmlGenerator::beginState
          (PlantUmlGenerator *this,ostream *output,string *indent,ScName *name,ScName *nameAlias)

{
  bool bVar1;
  ostream *poVar2;
  undefined1 local_50 [8];
  ScName nameShort;
  ScName *nameAlias_local;
  ScName *name_local;
  string *indent_local;
  ostream *output_local;
  PlantUmlGenerator *this_local;
  
  nameShort.field_2._8_8_ = nameAlias;
  removeNamespaces((ScName *)local_50,name);
  bVar1 = ::AbstractGenerator::isHighlighted(&this->super_AbstractGenerator,name);
  if (bVar1) {
    poVar2 = std::operator<<(output,(string *)indent);
    poVar2 = std::operator<<(poVar2,"state \"");
    poVar2 = std::operator<<(poVar2,(string *)local_50);
    poVar2 = std::operator<<(poVar2,"\" as ");
    poVar2 = std::operator<<(poVar2,(string *)nameShort.field_2._8_8_);
    std::operator<<(poVar2," #IndianRed {\n");
  }
  else {
    poVar2 = std::operator<<(output,(string *)indent);
    poVar2 = std::operator<<(poVar2,"state \"");
    poVar2 = std::operator<<(poVar2,(string *)local_50);
    poVar2 = std::operator<<(poVar2,"\" as ");
    poVar2 = std::operator<<(poVar2,(string *)nameShort.field_2._8_8_);
    std::operator<<(poVar2," {\n");
  }
  std::__cxx11::string::append((char *)indent);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void PlantUmlGenerator::beginState(std::ostream &output, std::string &indent, const ScName &name,
                                   const ScName &nameAlias)
{
    const ScName nameShort = removeNamespaces(name);

    if (isHighlighted(name)) {
        output << indent << "state \"" << nameShort << "\" as " << nameAlias << " #IndianRed {\n";
    } else {
        output << indent << "state \"" << nameShort << "\" as " << nameAlias << " {\n";
    }

    indent.append("  ");
}